

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O2

vector<KTX_header2,_std::allocator<KTX_header2>_> * __thiscall
ktx::CommandCompare::read<KTX_header2>
          (vector<KTX_header2,_std::allocator<KTX_header2>_> *__return_storage_ptr__,
          CommandCompare *this,InputStreams *streams,size_t offset,string_view what)

{
  long lVar1;
  allocator_type local_49;
  char *local_48;
  size_t local_40;
  char *pcStack_38;
  
  local_48 = what._M_str;
  std::vector<KTX_header2,_std::allocator<KTX_header2>_>::vector(__return_storage_ptr__,2,&local_49)
  ;
  for (lVar1 = 0; lVar1 != 0xa0; lVar1 = lVar1 + 0x50) {
    pcStack_38 = local_48;
    local_40 = what._M_len;
    read(this,(int)streams,(void *)offset,
         (size_t)(((__return_storage_ptr__->
                   super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>)._M_impl.
                   super__Vector_impl_data._M_start)->identifier + lVar1));
    streams = (InputStreams *)&streams->field_0x3b8;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> read(InputStreams& streams, std::size_t offset, std::string_view what) {
        std::vector<T> result(streams.size());
        for (std::size_t i = 0; i < streams.size(); ++i) {
            read(streams[i], offset, &result[i], sizeof(T), what);
        }
        return result;
    }